

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceConfig_ProducerConfig::TraceConfig_ProducerConfig
          (TraceConfig_ProducerConfig *this,TraceConfig_ProducerConfig *param_1)

{
  uint32_t uVar1;
  TraceConfig_ProducerConfig *param_1_local;
  TraceConfig_ProducerConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_ProducerConfig_009c1a40;
  ::std::__cxx11::string::string((string *)&this->producer_name_,(string *)&param_1->producer_name_)
  ;
  uVar1 = param_1->page_size_kb_;
  this->shm_size_kb_ = param_1->shm_size_kb_;
  this->page_size_kb_ = uVar1;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TraceConfig_ProducerConfig::TraceConfig_ProducerConfig(TraceConfig_ProducerConfig&&) noexcept = default;